

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

void __thiscall
LongReadsMapper::LongReadsMapper(LongReadsMapper *this,LongReadsDatastore *ds,LongReadsMapper *o)

{
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  vector<long,_std::allocator<long>_> *in_stack_00000008;
  vector<long,_std::allocator<long>_> *in_stack_00000010;
  
  *in_RDI = *in_RDX;
  *(undefined4 *)(in_RDI + 1) = 200;
  *(undefined1 *)((long)in_RDI + 0xc) = *(undefined1 *)((long)in_RDX + 0xc);
  *(undefined4 *)(in_RDI + 2) = 1000;
  *(undefined4 *)((long)in_RDI + 0x14) = 0x32;
  *(undefined4 *)(in_RDI + 3) = 500;
  *(undefined4 *)((long)in_RDI + 0x1c) = 4;
  *(undefined4 *)(in_RDI + 4) = 0x3c;
  *(undefined4 *)((long)in_RDI + 0x24) = 0x32;
  in_RDI[5] = in_RSI;
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::vector
            ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)0x3fa7db);
  std::vector<long,_std::allocator<long>_>::vector(in_stack_00000010,in_stack_00000008);
  std::
  unordered_map<std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>,_std::hash<std::pair<long,_long>_>,_std::equal_to<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>_>_>
  ::unordered_map((unordered_map<std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>,_std::hash<std::pair<long,_long>_>,_std::equal_to<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>_>_>
                   *)0x3fa80b);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)in_stack_00000010,
           (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)in_stack_00000008);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x3fa83b);
  *(undefined1 *)(in_RDI + 0x19) = 0;
  return;
}

Assistant:

LongReadsMapper::LongReadsMapper(const LongReadsDatastore &ds, const LongReadsMapper &o) :
datastore(ds),
sg(o.sg),
read_paths(o.read_paths),
first_mapping(o.first_mapping),
k(o.k)
{}